

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O0

uint32_t lookup_bte32(CPUX86State *env,uint32_t base,uintptr_t ra)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t bt;
  uint32_t bde;
  uint32_t bndcsr;
  uintptr_t ra_local;
  uint32_t base_local;
  CPUX86State *env_local;
  
  if ((env->hflags & 3) == 3) {
    bt = (uint32_t)(env->bndcs_regs).cfgu;
  }
  else {
    bt = (uint32_t)env->msr_bndcfgs;
  }
  uVar1 = extract32(base,0xc,0x14);
  uVar2 = uVar1 * 4 + (bt & 0xfffff000);
  uVar1 = cpu_ldl_data_ra_x86_64(env,(ulong)uVar2,ra);
  if ((uVar1 & 1) == 0) {
    (env->bndcs_regs).sts = (ulong)(uVar2 | 2);
    raise_exception_ra_x86_64(env,5,ra);
  }
  uVar3 = extract32(base,2,10);
  return uVar3 * 0x10 + (uVar1 & 0xfffffffc);
}

Assistant:

static uint32_t lookup_bte32(CPUX86State *env, uint32_t base, uintptr_t ra)
{
    uint32_t bndcsr, bde, bt;

    if ((env->hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    bde = (extract32(base, 12, 20) << 2) + (bndcsr & TARGET_PAGE_MASK);
    bt = cpu_ldl_data_ra(env, bde, ra);
    if ((bt & 1) == 0) {
        env->bndcs_regs.sts = bde | 2;
        raise_exception_ra(env, EXCP05_BOUND, ra);
    }

    return (extract32(base, 2, 10) << 4) + (bt & ~3);
}